

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * writer_thread(void *args)

{
  int i;
  storage_t *st;
  storage_t *in_stack_00000060;
  storage_t *in_stack_00000e00;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    load_persons(in_stack_00000e00);
    if (local_14 == 5) {
      delete_persons(in_stack_00000060);
    }
  }
  return (void *)0x0;
}

Assistant:

void *writer_thread(void *args) {

    storage_t *st = (storage_t *)args;
    for (int i = 0; i < 5; ++i) {
        load_persons(st);
        if (i == 5) {
            delete_persons(st);
        }
    }
    return NULL;
}